

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isAllowedInModule(SyntaxKind kind)

{
  bool local_9;
  SyntaxKind kind_local;
  
  if (((((kind == ExternModuleDecl) || (kind == GenerateRegion)) || (kind == InterfaceDeclaration))
      || ((kind == ModuleDeclaration || (kind == PortDeclaration)))) ||
     ((kind == ProgramDeclaration || ((kind - SpecifyBlock < 2 || (kind == TimeUnitsDeclaration)))))
     ) {
    local_9 = true;
  }
  else {
    local_9 = isAllowedInGenerate(kind);
  }
  return local_9;
}

Assistant:

bool SyntaxFacts::isAllowedInModule(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::PortDeclaration:
        case SyntaxKind::GenerateRegion:
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::InterfaceDeclaration:
        case SyntaxKind::ProgramDeclaration:
        case SyntaxKind::ExternModuleDecl:
        case SyntaxKind::TimeUnitsDeclaration:
        case SyntaxKind::SpecparamDeclaration:
        case SyntaxKind::SpecifyBlock:
            return true;
        default:
            return isAllowedInGenerate(kind);
    }
}